

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printLevelRoundingMode(LevelRoundingMode lm)

{
  ostream *this;
  char *pcVar1;
  
  if (lm == ROUND_UP) {
    pcVar1 = "up";
  }
  else {
    if (lm != ROUND_DOWN) {
      this = std::operator<<((ostream *)&std::cout,"mode ");
      std::ostream::operator<<(this,lm);
      return;
    }
    pcVar1 = "down";
  }
  std::operator<<((ostream *)&std::cout,pcVar1);
  return;
}

Assistant:

void
printLevelRoundingMode (LevelRoundingMode lm)
{
    switch (lm)
    {
        case ROUND_DOWN: cout << "down"; break;

        case ROUND_UP: cout << "up"; break;

        default: cout << "mode " << int (lm); break;
    }
}